

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O1

int gost_grasshopper_mgm_cleanup(EVP_CIPHER_CTX *c)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  
  lVar2 = EVP_CIPHER_CTX_get_cipher_data();
  if (lVar2 == 0) {
    iVar4 = 0;
  }
  else {
    *(undefined8 *)(lVar2 + 0x38) = 0;
    *(undefined8 *)(lVar2 + 0x40) = 0;
    *(undefined8 *)(lVar2 + 0x28) = 0;
    *(undefined8 *)(lVar2 + 0x30) = 0;
    *(undefined8 *)(lVar2 + 0x18) = 0;
    *(undefined8 *)(lVar2 + 0x20) = 0;
    *(undefined8 *)(lVar2 + 8) = 0;
    *(undefined8 *)(lVar2 + 0x10) = 0;
    memset((void *)(lVar2 + 0x48),0,0x150);
    OPENSSL_cleanse((void *)(lVar2 + 0x1090),200);
    lVar1 = *(long *)(lVar2 + 0x1158);
    lVar3 = EVP_CIPHER_CTX_iv_noconst(c);
    iVar4 = 1;
    if (lVar1 != lVar3) {
      CRYPTO_free(*(void **)(lVar2 + 0x1158));
    }
  }
  return iVar4;
}

Assistant:

static int gost_grasshopper_mgm_cleanup(EVP_CIPHER_CTX *c)
{
    gost_mgm_ctx *mctx =
        (gost_mgm_ctx *)EVP_CIPHER_CTX_get_cipher_data(c);
    if (mctx == NULL)
        return 0;
    gost_grasshopper_cipher_destroy(&mctx->ks.gh_ks);
    OPENSSL_cleanse(&mctx->mgm, sizeof(mctx->mgm));
    if (mctx->iv != EVP_CIPHER_CTX_iv_noconst(c))
        OPENSSL_free(mctx->iv);
    return 1;
}